

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

int getpos(coord *cc,boolean force,char *goal)

{
  int ret;
  int y;
  int x;
  uint local_40;
  uint local_3c;
  coord *local_38;
  
  local_3c = (uint)cc->x;
  local_40 = (uint)cc->y;
  local_38 = cc;
  flush_screen();
  do {
    ret = (*windowprocs.win_getpos)((int *)&local_3c,(int *)&local_40,force,goal);
    if (force == '\0') {
      log_getpos(ret,local_3c,local_40);
      if (ret != -1) goto LAB_00289767;
      pline("<position: (cancelled)>");
      goto LAB_0028977d;
    }
  } while ((0x15 < (int)local_40 ||
           (0x50 < (int)local_3c || ((int)local_40 < 1 || (int)local_3c < 1))) || ret == -1);
  log_getpos(ret,local_3c,local_40);
LAB_00289767:
  pline("<position: (%d, %d)>",(ulong)local_3c,(ulong)local_40);
LAB_0028977d:
  suppress_more();
  local_38->x = (xchar)local_3c;
  local_38->y = (xchar)local_40;
  return ret;
}

Assistant:

int getpos(coord *cc, boolean force, const char *goal)
{
	int rv = -1, x, y;
	
	x = cc->x;
	y = cc->y;
	
	flush_screen();
	
	do {
	    rv = (*windowprocs.win_getpos)(&x, &y, force, goal);
	} while (force && (rv == -1 || x < 1 || y < 1 || x > COLNO || y > ROWNO));
	log_getpos(rv, x, y);
	if (rv == -1)
	    pline("<position: (cancelled)>");
	else
	    pline("<position: (%d, %d)>", x, y);
	suppress_more();

	cc->x = x;
	cc->y = y;
	
	return rv;
}